

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzarc3d.h
# Opt level: O0

void __thiscall pzgeom::TPZArc3D::Print(TPZArc3D *this,ostream *out)

{
  ostream *poVar1;
  void *this_00;
  ostream *in_RSI;
  ostream *in_RDI;
  TPZNodeRep<3,_pztopology::TPZLine> *unaff_retaddr;
  TPZVec<double> *in_stack_00000028;
  ostream *in_stack_00000030;
  MatrixOutputFormat in_stack_0000036c;
  ostream *in_stack_00000370;
  char *in_stack_00000378;
  TPZMatrix<double> *in_stack_00000380;
  
  TPZNodeRep<3,_pztopology::TPZLine>::Print(unaff_retaddr,in_RDI);
  std::operator<<(in_RSI,"fCenter3D ");
  poVar1 = ::operator<<(in_stack_00000030,in_stack_00000028);
  std::operator<<(poVar1," finitialVector ");
  poVar1 = ::operator<<(in_stack_00000030,in_stack_00000028);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RSI,"fAngle ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(double *)(in_RDI + 0x250));
  poVar1 = std::operator<<(poVar1," fRadius ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(double *)(in_RDI + 600));
  poVar1 = std::operator<<(poVar1," fXcenter ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(double *)(in_RDI + 0x260));
  poVar1 = std::operator<<(poVar1," fYcenter ");
  this_00 = (void *)std::ostream::operator<<(poVar1,*(double *)(in_RDI + 0x268));
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  TPZMatrix<double>::Print(in_stack_00000380,in_stack_00000378,in_stack_00000370,in_stack_0000036c);
  TPZMatrix<double>::Print(in_stack_00000380,in_stack_00000378,in_stack_00000370,in_stack_0000036c);
  return;
}

Assistant:

void Print(std::ostream &out) const
		{
			pzgeom::TPZNodeRep<3,pztopology::TPZLine>::Print(out);
			out << "fCenter3D " << fCenter3D << " finitialVector " << finitialVector << std::endl;
			out << "fAngle " << fAngle << " fRadius " << fRadius << " fXcenter " << fXcenter << " fYcenter " << fYcenter << std::endl;
			fICnBase.Print("fICnBase", out);
			fIBaseCn.Print("fIBaseCn", out);
		}